

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O2

int Nm_ManTableAdd(Nm_Man_t *p,Nm_Entry_t *pEntry)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Nm_Entry_t **ppNVar5;
  Nm_Entry_t **ppNVar6;
  Nm_Entry_t *pNVar7;
  ulong uVar8;
  Nm_Entry_t *pNVar9;
  uint uVar10;
  int iVar11;
  Nm_Entry_t *pNVar12;
  long lStack_70;
  timespec local_40;
  
  uVar10 = p->nBins;
  if (p->nEntries <= (int)(p->nSizeFactor * uVar10)) {
LAB_0038981f:
    uVar4 = pEntry->ObjId;
    pNVar7 = Nm_ManTableLookupId(p,uVar4);
    if (pNVar7 != (Nm_Entry_t *)0x0) {
      __assert_fail("Nm_ManTableLookupId(p, pEntry->ObjId) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/nm/nmTable.c"
                    ,0x4e,"int Nm_ManTableAdd(Nm_Man_t *, Nm_Entry_t *)");
    }
    ppNVar5 = p->pBinsI2N;
    uVar4 = Nm_HashNumber(uVar4,uVar10);
    pEntry->pNextI2N = ppNVar5[uVar4];
    ppNVar5[uVar4] = pEntry;
    pNVar7 = Nm_ManTableLookupName(p,(char *)(pEntry + 1),-1);
    if (pNVar7 == (Nm_Entry_t *)0x0) {
      ppNVar5 = p->pBinsN2I;
      uVar10 = Nm_HashString((char *)(pEntry + 1),uVar10);
      ppNVar5 = ppNVar5 + uVar10;
      pNVar9 = *ppNVar5;
      lStack_70 = 0x10;
    }
    else {
      ppNVar5 = &pNVar7->pNameSake;
      pNVar9 = pNVar7->pNameSake;
      if (pNVar7->pNameSake == (Nm_Entry_t *)0x0) {
        pNVar9 = pNVar7;
      }
      lStack_70 = 0x18;
    }
    *(Nm_Entry_t **)((long)&pEntry->Type + lStack_70) = pNVar9;
    *ppNVar5 = pEntry;
    p->nEntries = p->nEntries + 1;
    return 1;
  }
  clock_gettime(3,&local_40);
  uVar4 = p->nBins;
  uVar3 = p->nGrowthFactor * uVar4 - 1;
  do {
    do {
      uVar10 = uVar3 + 1;
      uVar2 = uVar3 & 1;
      uVar3 = uVar10;
    } while (uVar2 != 0);
    uVar8 = 3;
    do {
      iVar11 = (int)uVar8;
      if (uVar10 < (uint)(iVar11 * iVar11)) {
        ppNVar5 = (Nm_Entry_t **)calloc(1,(long)(int)uVar10 << 3);
        ppNVar6 = (Nm_Entry_t **)calloc(1,(long)(int)uVar10 << 3);
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        iVar11 = 0;
        for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
          pNVar7 = p->pBinsI2N[uVar8];
          if (pNVar7 != (Nm_Entry_t *)0x0) goto LAB_00389773;
          pNVar9 = (Nm_Entry_t *)0x0;
          pNVar12 = pNVar7;
          while (pNVar7 = pNVar9, pNVar12 != (Nm_Entry_t *)0x0) {
            uVar3 = Nm_HashNumber(pNVar12->ObjId,uVar10);
            pNVar12->pNextI2N = ppNVar5[uVar3];
            ppNVar5[uVar3] = pNVar12;
            iVar11 = iVar11 + 1;
            pNVar9 = (Nm_Entry_t *)0x0;
            pNVar12 = pNVar7;
            if (pNVar7 != (Nm_Entry_t *)0x0) {
LAB_00389773:
              pNVar9 = pNVar7->pNextI2N;
              pNVar12 = pNVar7;
            }
          }
        }
        for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
          pNVar7 = p->pBinsN2I[uVar8];
          if (pNVar7 != (Nm_Entry_t *)0x0) goto LAB_003897d6;
          pNVar9 = (Nm_Entry_t *)0x0;
          pNVar12 = pNVar7;
          while (pNVar7 = pNVar9, pNVar12 != (Nm_Entry_t *)0x0) {
            uVar3 = Nm_HashString((char *)(pNVar12 + 1),uVar10);
            pNVar12->pNextN2I = ppNVar6[uVar3];
            ppNVar6[uVar3] = pNVar12;
            pNVar9 = (Nm_Entry_t *)0x0;
            pNVar12 = pNVar7;
            if (pNVar7 != (Nm_Entry_t *)0x0) {
LAB_003897d6:
              pNVar9 = pNVar7->pNextN2I;
              pNVar12 = pNVar7;
            }
          }
        }
        if (iVar11 != p->nEntries) {
          __assert_fail("Counter == p->nEntries",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/nm/nmTable.c"
                        ,0x122,"void Nm_ManResize(Nm_Man_t *)");
        }
        if (p->pBinsI2N != (Nm_Entry_t **)0x0) {
          free(p->pBinsI2N);
          p->pBinsI2N = (Nm_Entry_t **)0x0;
        }
        free(p->pBinsN2I);
        p->pBinsI2N = ppNVar5;
        p->pBinsN2I = ppNVar6;
        p->nBins = uVar10;
        goto LAB_0038981f;
      }
      uVar1 = (ulong)uVar10 % uVar8;
      uVar8 = (ulong)(iVar11 + 2);
    } while ((int)uVar1 != 0);
  } while( true );
}

Assistant:

int Nm_ManTableAdd( Nm_Man_t * p, Nm_Entry_t * pEntry )
{
    Nm_Entry_t ** ppSpot, * pOther;
    // resize the tables if needed
    if ( p->nEntries > p->nBins * p->nSizeFactor )
        Nm_ManResize( p );
    // add the entry to the table Id->Name
    assert( Nm_ManTableLookupId(p, pEntry->ObjId) == NULL );
    ppSpot = p->pBinsI2N + Nm_HashNumber(pEntry->ObjId, p->nBins);
    pEntry->pNextI2N = *ppSpot;
    *ppSpot = pEntry;
    // check if an entry with the same name already exists
    if ( (pOther = Nm_ManTableLookupName(p, pEntry->Name, -1)) )
    {
        // entry with the same name already exists - add it to the ring
        pEntry->pNameSake = pOther->pNameSake? pOther->pNameSake : pOther;
        pOther->pNameSake = pEntry;
    }
    else
    {
        // entry with the same name does not exist - add it to the table
        ppSpot = p->pBinsN2I + Nm_HashString(pEntry->Name, p->nBins);
        pEntry->pNextN2I = *ppSpot;
        *ppSpot = pEntry;
    }
    // report successfully added entry
    p->nEntries++;
    return 1;
}